

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3_free_table(char **azResult)

{
  int iVar1;
  long lVar2;
  
  if (azResult != (char **)0x0) {
    iVar1 = *(int *)(azResult + -1);
    for (lVar2 = 1; lVar2 < iVar1; lVar2 = lVar2 + 1) {
      if (azResult[lVar2 + -1] != (char *)0x0) {
        sqlite3_free(azResult[lVar2 + -1]);
      }
    }
    sqlite3_free(azResult + -1);
    return;
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_free_table(
  char **azResult            /* Result returned from from sqlite3_get_table() */
){
  if( azResult ){
    int i, n;
    azResult--;
    assert( azResult!=0 );
    n = SQLITE_PTR_TO_INT(azResult[0]);
    for(i=1; i<n; i++){ if( azResult[i] ) sqlite3_free(azResult[i]); }
    sqlite3_free(azResult);
  }
}